

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

void __thiscall helics::BrokerBase::writeProfilingData(BrokerBase *this)

{
  ProfilerBuffer *this_00;
  
  this_00 = (this->prBuff).super___shared_ptr<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (ProfilerBuffer *)0x0) {
    ProfilerBuffer::writeFile(this_00);
  }
  return;
}

Assistant:

void BrokerBase::writeProfilingData()
{
    if (prBuff) {
        try {
            prBuff->writeFile();
        }
        catch (const std::ios_base::failure&) {
            sendToLogger(parent_broker_id,
                         LogLevels::ERROR_LEVEL,
                         identifier,
                         "Unable to write profiling buffer data");
        }
    }
}